

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O0

Rect __thiscall lunasvg::SVGGeometryElement::strokeBoundingBox(SVGGeometryElement *this)

{
  Rect RVar1;
  bool bVar2;
  LineCap LVar3;
  LineJoin LVar4;
  float *pfVar5;
  reference this_00;
  float fVar6;
  SVGGeometryElement *extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  Rect local_58;
  reference local_48;
  SVGMarkerPosition *markerPosition;
  const_iterator __end1;
  const_iterator __begin1;
  SVGMarkerPositionList *__range1;
  float joinLimit;
  float capLimit;
  SVGGeometryElement *this_local;
  Rect strokeBoundingBox;
  
  _joinLimit = this;
  (*(this->super_SVGGraphicsElement).super_SVGElement.super_SVGNode._vptr_SVGNode[0xb])();
  this_local = extraout_XMM0_Qa;
  strokeBoundingBox._0_8_ = in_XMM1_Qa;
  bVar2 = SVGPaintServer::isRenderable(&this->m_stroke);
  if (bVar2) {
    fVar6 = StrokeData::lineWidth(&this->m_strokeData);
    __range1._4_4_ = fVar6 / 2.0;
    LVar3 = StrokeData::lineCap(&this->m_strokeData);
    if (LVar3 == Square) {
      __range1._4_4_ = __range1._4_4_ * 1.4142135;
    }
    fVar6 = StrokeData::lineWidth(&this->m_strokeData);
    __range1._0_4_ = fVar6 / 2.0;
    LVar4 = StrokeData::lineJoin(&this->m_strokeData);
    if (LVar4 == Miter) {
      fVar6 = StrokeData::miterLimit(&this->m_strokeData);
      __range1._0_4_ = fVar6 * __range1._0_4_;
    }
    pfVar5 = std::max<float>((float *)((long)&__range1 + 4),(float *)&__range1);
    Rect::inflate((Rect *)&this_local,*pfVar5);
  }
  __end1 = std::vector<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>::
           begin(&this->m_markerPositions);
  markerPosition =
       (SVGMarkerPosition *)
       std::vector<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>::end
                 (&this->m_markerPositions);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_lunasvg::SVGMarkerPosition_*,_std::vector<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>_>
                                     *)&markerPosition), bVar2) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_lunasvg::SVGMarkerPosition_*,_std::vector<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>_>
              ::operator*(&__end1);
    local_48 = this_00;
    fVar6 = StrokeData::lineWidth(&this->m_strokeData);
    local_58 = SVGMarkerPosition::markerBoundingBox(this_00,fVar6);
    Rect::unite((Rect *)&this_local,&local_58);
    __gnu_cxx::
    __normal_iterator<const_lunasvg::SVGMarkerPosition_*,_std::vector<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>_>
    ::operator++(&__end1);
  }
  RVar1.w = strokeBoundingBox.x;
  RVar1.h = strokeBoundingBox.y;
  RVar1._0_8_ = this_local;
  return RVar1;
}

Assistant:

Rect SVGGeometryElement::strokeBoundingBox() const
{
    auto strokeBoundingBox = fillBoundingBox();
    if(m_stroke.isRenderable()) {
        float capLimit = m_strokeData.lineWidth() / 2.f;
        if(m_strokeData.lineCap() == LineCap::Square)
            capLimit *= PLUTOVG_SQRT2;
        float joinLimit = m_strokeData.lineWidth() / 2.f;
        if(m_strokeData.lineJoin() == LineJoin::Miter) {
            joinLimit *= m_strokeData.miterLimit();
        }

        strokeBoundingBox.inflate(std::max(capLimit, joinLimit));
    }

    for(const auto& markerPosition : m_markerPositions)
        strokeBoundingBox.unite(markerPosition.markerBoundingBox(m_strokeData.lineWidth()));
    return strokeBoundingBox;
}